

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpVarint<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  uint32_t *data_00;
  byte *pbVar3;
  bool bVar4;
  FieldEntry *entry;
  char *pcVar5;
  unsigned_long *puVar6;
  string *psVar7;
  ulong uVar8;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar9;
  short sVar10;
  uint uVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  ParseContext *pPVar13;
  uint value;
  unsigned_long uVar14;
  ushort *puVar15;
  uint uVar16;
  ushort uVar17;
  unsigned_short local_4a;
  ushort *local_48;
  ushort local_40 [8];
  
  entry = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                    (table,(ulong)data.field_0 >> 0x20);
  uVar2 = entry->type_card;
  uVar16 = uVar2 & 0x30;
  if (uVar16 == 0x20) {
    pcVar5 = MpRepeatedVarint<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  if (((ulong)data.field_0 & 7) == 0) {
    uVar14 = (unsigned_long)*ptr;
    if ((long)uVar14 < 0) {
      aVar12.data = (long)ptr[1] << 7 | 0x7f;
      if ((long)aVar12 < 0) {
        pPVar13 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
        if ((long)pPVar13 < 0) {
          aVar12.data = aVar12.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)aVar12 < 0) {
            pPVar13 = (ParseContext *)((ulong)pPVar13 & ((long)ptr[4] << 0x1c | 0xfffffffU));
            if ((long)pPVar13 < 0) {
              aVar12.data = aVar12.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)aVar12 < 0) {
                pPVar13 = (ParseContext *)((ulong)pPVar13 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU))
                ;
                if ((long)pPVar13 < 0) {
                  aVar12.data = aVar12.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar12 < 0) {
                    pPVar13 = (ParseContext *)
                              ((ulong)pPVar13 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar13 < 0) {
                      puVar15 = (ushort *)(ptr + 10);
                      bVar1 = ptr[9];
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar5 = Error(msg,(char *)CONCAT71((int7)((ulong)ptr >> 8),bVar1),pPVar13
                                         ,(TcFieldData)aVar12,table,hasbits);
                          return pcVar5;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar13 = (ParseContext *)((ulong)pPVar13 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar15 = (ushort *)(ptr + 9);
                    }
                  }
                  else {
                    puVar15 = (ushort *)(ptr + 8);
                  }
                }
                else {
                  puVar15 = (ushort *)(ptr + 7);
                }
              }
              else {
                puVar15 = (ushort *)(ptr + 6);
              }
            }
            else {
              puVar15 = (ushort *)(ptr + 5);
            }
          }
          else {
            puVar15 = (ushort *)(ptr + 4);
          }
        }
        else {
          puVar15 = (ushort *)(ptr + 3);
        }
        aVar12.data = aVar12.data & (ulong)pPVar13;
      }
      else {
        puVar15 = (ushort *)(ptr + 2);
      }
      uVar14 = uVar14 & aVar12.data;
    }
    else {
      puVar15 = (ushort *)(ptr + 1);
    }
    uVar11 = uVar2 & 0x600;
    pPVar13 = (ParseContext *)(ulong)uVar11;
    uVar17 = uVar2 & 0x1c0;
    value = (uint)uVar14;
    sVar10 = (short)uVar11;
    if (uVar17 == 0xc0) {
      if (sVar10 == 0x200) {
        uVar14 = -(ulong)(value & 1) ^ uVar14 >> 1;
      }
    }
    else if (uVar17 == 0x80) {
      if ((uVar2 >> 10 & 1) == 0) {
        if (sVar10 == 0x200) {
          uVar14 = (unsigned_long)(int)(-(value & 1) ^ (uint)(uVar14 >> 1) & 0x7fffffff);
        }
      }
      else {
        data_00 = *(uint32_t **)
                   ((long)&table->has_bits_offset +
                   (ulong)entry->aux_idx * 8 + (ulong)table->aux_offset);
        if (sVar10 == 0x600) {
          if (((int)value < (int)(short)data_00) ||
             ((int)((int)(short)data_00 + ((uint)((ulong)data_00 >> 0x10) & 0xffff)) <= (int)value))
          {
LAB_002698a9:
            pcVar5 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
            return pcVar5;
          }
        }
        else {
          local_48 = puVar15;
          bVar4 = ValidateEnum(value,data_00);
          puVar15 = local_48;
          if (!bVar4) goto LAB_002698a9;
        }
      }
    }
    if (uVar16 == 0x30) {
      ChangeOneof(table,entry,(uint)((ulong)data.field_0 >> 3) & 0x1fffffff,pPVar13,msg);
    }
    else if (uVar16 == 0x10) {
      pbVar3 = (byte *)((long)&msg->_vptr_MessageLite + ((long)entry->has_idx >> 3));
      *pbVar3 = *pbVar3 | '\x01' << (entry->has_idx & 7U);
    }
    if (uVar17 == 0xc0) {
      puVar6 = RefAt<unsigned_long>(msg,(ulong)entry->offset);
      *puVar6 = uVar14;
    }
    else if (uVar17 == 0x80) {
      puVar9 = RefAt<unsigned_int>(msg,(ulong)entry->offset);
      *puVar9 = (uint)uVar14;
    }
    else {
      local_4a = 0;
      local_40[0] = uVar17;
      psVar7 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                         (local_40,&local_4a,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)"
                         );
      if (psVar7 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x76d,psVar7->_M_string_length,(psVar7->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)entry->offset) = uVar14 != 0;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar15) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar9 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar9 = *puVar9 | (uint)hasbits;
      }
      return (char *)puVar15;
    }
    uVar16 = (uint)table->fast_idx_mask & (uint)*puVar15;
    if ((uVar16 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar8 = (ulong)(uVar16 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)*puVar15 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar8);
  }
  else {
    UNRECOVERED_JUMPTABLE = table->fallback;
    puVar15 = (ushort *)ptr;
  }
  pcVar5 = (*UNRECOVERED_JUMPTABLE)(msg,(char *)puVar15,ctx,data,table,hasbits);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpVarint(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedVarint<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for wire type mismatch:
  if ((data.tag() & 7) != WireFormatLite::WIRETYPE_VARINT) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  // Parse the value:
  const char* ptr2 = ptr;  // save for unknown enum case
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (ptr == nullptr) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }

  // Transform and/or validate the value
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode64(tmp);
    }
  } else if (rep == field_layout::kRep32Bits) {
    if (is_validated_enum) {
      if (!EnumIsValidAux(tmp, xform_val, *table->field_aux(&entry))) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
    }
  }

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = tmp;
  } else if (rep == field_layout::kRep32Bits) {
    RefAt<uint32_t>(base, entry.offset) = static_cast<uint32_t>(tmp);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep8Bits));
    RefAt<bool>(base, entry.offset) = static_cast<bool>(tmp);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}